

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_encode.c
# Opt level: O0

void hexToDigit(uint *val,uchar *hex)

{
  uchar c;
  uint i;
  uchar *hex_local;
  uint *val_local;
  
  for (i = 0; i < 4; i = i + 1) {
    c = hex[i];
    if (0x40 < c) {
      c = (c & 0xdf) - 7;
    }
    *val = *val << 4 | (uint)(byte)(c - 0x30);
  }
  return;
}

Assistant:

static void hexToDigit(unsigned int * val, const unsigned char * hex)
{
    unsigned int i;
    for (i=0;i<4;i++) {
        unsigned char c = hex[i];
        if (c >= 'A') c = (c & ~0x20) - 7;
        c -= '0';
        assert(!(c & 0xF0));
        *val = (*val << 4) | c;
    }
}